

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_astLambdaNode_primitiveAnalyze
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong uVar1;
  sysbvm_functionDefinition_t *functionDefinition;
  _Bool _Var2;
  sysbvm_tuple_t sVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  uint64_t value;
  ulong uVar7;
  bool bVar8;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_tuple_t local_a8;
  sysbvm_tuple_t sStack_a0;
  ulong local_98;
  sysbvm_tuple_t sStack_90;
  sysbvm_functionDefinition_t *local_88;
  sysbvm_tuple_t sStack_80;
  sysbvm_tuple_t local_78;
  sysbvm_tuple_t sStack_70;
  sysbvm_tuple_t local_68;
  ulong uStack_60;
  sysbvm_stackFrameRecord_t local_50;
  undefined8 local_40;
  sysbvm_stackFrameRecord_t local_38;
  undefined8 local_28;
  sysbvm_tuple_t *psStack_20;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  psStack_20 = &local_a8;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  sStack_70 = 0;
  local_88 = (sysbvm_functionDefinition_t *)0x0;
  sStack_80 = 0;
  local_98 = 0;
  sStack_90 = 0;
  local_a8 = 0;
  sStack_a0 = 0;
  local_38.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_38.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_38._12_4_ = 0;
  local_28 = 10;
  sysbvm_stackFrame_pushRecord(&local_38);
  local_a8 = sysbvm_context_shallowCopy(context,*arguments);
  sVar3 = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context,arguments[1]);
  *(sysbvm_tuple_t *)(local_a8 + 0x18) = sVar3;
  local_50.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_50.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  local_40 = *(undefined8 *)(local_a8 + 0x10);
  sysbvm_stackFrame_pushRecord(&local_50);
  if (*(sysbvm_tuple_t *)(local_a8 + 0x28) != 0) {
    sStack_a0 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                          (context,*(sysbvm_tuple_t *)(local_a8 + 0x28),(context->roots).symbolType,
                           arguments[1]);
    *(sysbvm_tuple_t *)(local_a8 + 0x28) = sStack_a0;
    _Var2 = sysbvm_astNode_isLiteralNode(context,sStack_a0);
    if (!_Var2) {
      sysbvm_error("Local lambda analyzed name must be a literal node.");
    }
    local_68 = sysbvm_astLiteralNode_getValue(sStack_a0);
  }
  uVar1 = *(ulong *)(local_a8 + 0x40);
  bVar8 = (uVar1 & 0xf) != 0;
  if (bVar8 || uVar1 == 0) {
    uVar5 = 0;
  }
  else {
    uVar5 = (ulong)(*(uint *)(uVar1 + 0xc) >> 3);
  }
  if (uVar5 == 0) {
    value = 0;
  }
  else {
    uVar6 = 0;
    value = 0;
    do {
      if (bVar8 || uVar1 == 0) {
        local_98 = 0;
      }
      else {
        local_98 = *(ulong *)(uVar1 + 0x10 + uVar6 * 8);
      }
      uVar7 = 1;
      if ((local_98 & 0xf) == 0 && local_98 != 0) {
        uVar7 = (ulong)(*(long *)(local_98 + 0x28) != 0x1f);
      }
      value = value + uVar7;
      uVar6 = uVar6 + 1;
    } while (uVar5 != uVar6);
  }
  if (value + 0x800000000000000 >> 0x3c == 0) {
    sStack_90 = value << 4 | 0xb;
  }
  else {
    sStack_90 = sysbvm_tuple_uint64_encodeBig(context,value);
  }
  local_88 = (sysbvm_functionDefinition_t *)
             sysbvm_functionDefinition_create
                       (context,*(sysbvm_tuple_t *)(local_a8 + 0x10),
                        *(sysbvm_tuple_t *)(local_a8 + 0x30),*(sysbvm_tuple_t *)(local_a8 + 0x38),
                        sStack_90,arguments[1],*(sysbvm_tuple_t *)(local_a8 + 0x40),
                        *(sysbvm_tuple_t *)(local_a8 + 0x48),*(sysbvm_tuple_t *)(local_a8 + 0x50));
  *(sysbvm_functionDefinition_t **)(local_a8 + 0x60) = local_88;
  sysbvm_analysisEnvironment_addInnerFunction(context,arguments[1],(sysbvm_tuple_t)local_88);
  sysbvm_functionDefinition_ensureAnalysis(context,&local_88);
  *(sysbvm_tuple_t *)(local_a8 + 0x20) = local_88->type;
  sVar3 = local_88->bytecode;
  lVar4 = 0x48;
  if (sVar3 == 0) {
    if (local_88->sourceAnalyzedDefinition == 0) {
      sysbvm_error_assertionFailure
                (
                "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/interpreter.c:1358: assertion failure: gcFrame.functionDefinition->sourceAnalyzedDefinition"
                );
    }
    sVar3 = local_88->sourceAnalyzedDefinition;
    lVar4 = 0x20;
  }
  functionDefinition = local_88;
  uStack_60 = *(ulong *)(sVar3 + lVar4);
  if (((uStack_60 & 0xf) == 0 && uStack_60 != 0) && (7 < *(uint *)(uStack_60 + 0xc))) {
    if (local_68 != 0) {
      sStack_70 = sysbvm_analysisEnvironment_setNewSymbolLocalBinding
                            (context,arguments[1],*(sysbvm_tuple_t *)(local_a8 + 0x10),local_68,
                             *(sysbvm_tuple_t *)(local_a8 + 0x20));
      *(sysbvm_tuple_t *)(local_a8 + 0x68) = sStack_70;
    }
    sysbvm_stackFrame_popRecord(&local_50);
    sysbvm_stackFrame_popRecord(&local_38);
    local_78 = local_a8;
  }
  else {
    sVar3 = sysbvm_sequenceTuple_create(context,local_88->captureVectorType);
    sStack_80 = sysbvm_function_createClosureWithCaptureVector
                          (context,(sysbvm_tuple_t)functionDefinition,sVar3);
    local_78 = sysbvm_astLiteralNode_create(context,*(sysbvm_tuple_t *)(local_a8 + 0x10),sStack_80);
    if (local_68 != 0) {
      sStack_70 = sysbvm_analysisEnvironment_setNewValueBinding
                            (context,arguments[1],*(sysbvm_tuple_t *)(local_a8 + 0x10),local_68,
                             sStack_80);
    }
    sysbvm_stackFrame_popRecord(&local_50);
    sysbvm_stackFrame_popRecord(&local_38);
  }
  return local_78;
}

Assistant:

static sysbvm_tuple_t sysbvm_astLambdaNode_primitiveAnalyze(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    struct {
        sysbvm_astLambdaNode_t *lambdaNode;
        sysbvm_tuple_t analyzedNameExpression;
        sysbvm_tuple_t argumentNode;
        sysbvm_tuple_t argumentCount;
        sysbvm_functionDefinition_t *functionDefinition;
        sysbvm_tuple_t capturelessFunction;
        sysbvm_tuple_t capturelessLiteral;
        sysbvm_tuple_t localBinding;
        sysbvm_tuple_t name;
        sysbvm_tuple_t captureList;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    gcFrame.lambdaNode = (sysbvm_astLambdaNode_t*)sysbvm_context_shallowCopy(context, *node);
    gcFrame.lambdaNode->super.analyzerToken = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context, *environment);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, gcFrame.lambdaNode->super.sourcePosition);

    if(gcFrame.lambdaNode->name)
    {
        gcFrame.analyzedNameExpression = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.lambdaNode->name, context->roots.symbolType, *environment);
        gcFrame.lambdaNode->name = gcFrame.analyzedNameExpression;
        if(!sysbvm_astNode_isLiteralNode(context, gcFrame.analyzedNameExpression))
            sysbvm_error("Local lambda analyzed name must be a literal node.");
        gcFrame.name = sysbvm_astLiteralNode_getValue(gcFrame.analyzedNameExpression);
    }

    // Count the actual argument count.
    size_t lambdaArgumentCount = 0;
    size_t argumentNodeCount = sysbvm_array_getSize(gcFrame.lambdaNode->arguments);
    for(size_t i = 0; i < argumentNodeCount; ++i)
    {
        gcFrame.argumentNode = sysbvm_array_at(gcFrame.lambdaNode->arguments, i);
        if(!sysbvm_astArgumentNode_isForAll(gcFrame.argumentNode))
            ++lambdaArgumentCount;
    }

    gcFrame.argumentCount = sysbvm_tuple_size_encode(context, lambdaArgumentCount);
    gcFrame.functionDefinition = (sysbvm_functionDefinition_t *)sysbvm_functionDefinition_create(context,
        gcFrame.lambdaNode->super.sourcePosition, gcFrame.lambdaNode->flags, gcFrame.lambdaNode->callingConventionName,
        gcFrame.argumentCount, *environment,
        gcFrame.lambdaNode->arguments, gcFrame.lambdaNode->resultType, gcFrame.lambdaNode->body
    );
    gcFrame.lambdaNode->functionDefinition = (sysbvm_tuple_t)gcFrame.functionDefinition;

    // Register the inner function.
    sysbvm_analysisEnvironment_addInnerFunction(context, *environment, (sysbvm_tuple_t)gcFrame.functionDefinition);

    // Perform the lambda analysis.
    sysbvm_functionDefinition_ensureAnalysis(context, &gcFrame.functionDefinition);

    gcFrame.lambdaNode->super.analyzedType = gcFrame.functionDefinition->type;
    if(gcFrame.functionDefinition->bytecode)
    {
        gcFrame.captureList = ((sysbvm_functionBytecode_t*)gcFrame.functionDefinition->bytecode)->captures;
    }
    else
    {
        SYSBVM_ASSERT(gcFrame.functionDefinition->sourceAnalyzedDefinition);
        gcFrame.captureList = ((sysbvm_functionSourceAnalyzedDefinition_t*)gcFrame.functionDefinition->sourceAnalyzedDefinition)->captures;
    }

    // Optimize lambdas without captures by turning them onto a literal.
    if(sysbvm_array_getSize(gcFrame.captureList) == 0)
    {
        gcFrame.capturelessFunction = sysbvm_function_createClosureWithCaptureVector(context, (sysbvm_tuple_t)gcFrame.functionDefinition, sysbvm_sequenceTuple_create(context, gcFrame.functionDefinition->captureVectorType));
        gcFrame.capturelessLiteral = sysbvm_astLiteralNode_create(context, gcFrame.lambdaNode->super.sourcePosition, gcFrame.capturelessFunction);
        if(gcFrame.name)
            gcFrame.localBinding = sysbvm_analysisEnvironment_setNewValueBinding(context, *environment, gcFrame.lambdaNode->super.sourcePosition, gcFrame.name, gcFrame.capturelessFunction);

        SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return gcFrame.capturelessLiteral;
    }

    if(gcFrame.name)
    {
        gcFrame.localBinding = sysbvm_analysisEnvironment_setNewSymbolLocalBinding(context, *environment, gcFrame.lambdaNode->super.sourcePosition, gcFrame.name, gcFrame.lambdaNode->super.analyzedType);
        gcFrame.lambdaNode->binding = gcFrame.localBinding;
    }

    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return (sysbvm_tuple_t)gcFrame.lambdaNode;
}